

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O1

void duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  idx_t iVar5;
  ulong *puVar6;
  unsigned_long *puVar7;
  anon_union_16_2_67f50693_for_value *paVar8;
  _func_int *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var11;
  undefined4 uVar13;
  data_ptr_t pdVar12;
  undefined4 uVar14;
  byte bVar15;
  anon_struct_16_3_d7536bce_for_pointer aVar16;
  undefined1 auVar17 [8];
  SelectionVector *pSVar18;
  SelectionVector *pSVar19;
  bool bVar20;
  reference vector;
  reference vector_00;
  BoundFunctionExpression *pBVar21;
  anon_class_8_1_898d11ac fun;
  TemplatedValidityData<unsigned_long> *pTVar22;
  idx_t iVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  long lVar26;
  data_ptr_t pdVar27;
  unsigned_long uVar28;
  idx_t iVar29;
  ulong uVar30;
  ValidityMask *in_R9;
  ulong uVar31;
  idx_t idx_in_entry;
  ulong uVar32;
  ulong uVar33;
  idx_t iVar34;
  ulong uVar35;
  long *plVar36;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  data_ptr_t local_f0;
  undefined1 local_d8 [8];
  SelectionVector *pSStack_d0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat local_80;
  idx_t local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  pBVar21 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  fun.info = (RegexpMatchesBindData *)
             unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&pBVar21->bind_info);
  if (((fun.info)->super_RegexpBaseBindData).constant_pattern == true) {
    local_80.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
    optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
              ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_80);
    pSVar18 = local_80.sel;
    iVar5 = args->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar25 = result->data;
      pdVar27 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar7 == (unsigned_long *)0x0) {
        if (iVar5 == 0) {
          return;
        }
        plVar36 = (long *)(pdVar27 + 8);
        iVar34 = 0;
        do {
          local_c8.sel = (SelectionVector *)plVar36[-1];
          local_c8.data = (data_ptr_t)*plVar36;
          local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
          local_80.sel = (SelectionVector *)local_c8.data;
          if (local_80.data < (data_ptr_t)0xd) {
            local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
          }
          bVar20 = duckdb_re2::RE2::FullMatchN
                             ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,(Arg **)0x0,0
                             );
          pdVar25[iVar34] = bVar20;
          iVar34 = iVar34 + 1;
          plVar36 = plVar36 + 2;
        } while (iVar5 != iVar34);
        return;
      }
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (iVar5 + 0x3f < 0x40) {
        return;
      }
      uVar24 = 0;
      uVar33 = 0;
      do {
        puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          uVar28 = 0xffffffffffffffff;
        }
        else {
          uVar28 = puVar7[uVar24];
        }
        uVar30 = uVar33 + 0x40;
        if (iVar5 <= uVar33 + 0x40) {
          uVar30 = iVar5;
        }
        uVar31 = uVar30;
        if (uVar28 != 0) {
          uVar31 = uVar33;
          if (uVar28 == 0xffffffffffffffff) {
            if (uVar33 < uVar30) {
              plVar36 = (long *)(pdVar27 + uVar33 * 0x10 + 8);
              do {
                local_c8.sel = (SelectionVector *)plVar36[-1];
                local_c8.data = (data_ptr_t)*plVar36;
                local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
                local_80.sel = (SelectionVector *)local_c8.data;
                if (local_80.data < (data_ptr_t)0xd) {
                  local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
                }
                bVar20 = duckdb_re2::RE2::FullMatchN
                                   ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,
                                    (Arg **)0x0,0);
                pdVar25[uVar31] = bVar20;
                uVar31 = uVar31 + 1;
                plVar36 = plVar36 + 2;
              } while (uVar30 != uVar31);
            }
          }
          else if (uVar33 < uVar30) {
            plVar36 = (long *)(pdVar27 + uVar33 * 0x10 + 8);
            uVar32 = 0;
            do {
              if ((uVar28 >> (uVar32 & 0x3f) & 1) != 0) {
                local_c8.sel = (SelectionVector *)plVar36[-1];
                local_c8.data = (data_ptr_t)*plVar36;
                local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
                local_80.sel = (SelectionVector *)local_c8.data;
                if (local_80.data < (data_ptr_t)0xd) {
                  local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
                }
                bVar20 = duckdb_re2::RE2::FullMatchN
                                   ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,
                                    (Arg **)0x0,0);
                pdVar25[uVar33] = bVar20;
              }
              uVar33 = uVar33 + 1;
              plVar36 = plVar36 + 2;
              uVar32 = uVar32 + 1;
              uVar31 = uVar33;
            } while (uVar30 != uVar33);
          }
        }
        uVar24 = uVar24 + 1;
        uVar33 = uVar31;
      } while (uVar24 != iVar5 + 0x3f >> 6);
      return;
    }
    if (vector->vector_type != CONSTANT_VECTOR) {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_80);
      Vector::ToUnifiedFormat(vector,iVar5,&local_80);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pSVar19 = local_80.sel;
      pdVar25 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (iVar5 != 0) {
          p_Var9 = (_func_int *)pSVar19->sel_vector;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (p_Var9 != (_func_int *)0x0) {
              iVar23 = (idx_t)*(uint *)(p_Var9 + iVar34 * 4);
            }
            local_d8 = *(undefined1 (*) [8])(local_80.data + iVar23 * 0x10);
            pSStack_d0 = *(SelectionVector **)(local_80.data + iVar23 * 0x10 + 8);
            local_c8.data = (data_ptr_t)((ulong)local_d8 & 0xffffffff);
            local_c8.sel = pSStack_d0;
            if (local_c8.data < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xd) {
              local_c8.sel = (SelectionVector *)(local_d8 + 4);
            }
            bVar20 = duckdb_re2::RE2::FullMatchN
                               ((StringPiece *)&local_c8,(RE2 *)&pSVar18->selection_data,(Arg **)0x0
                                ,0);
            pdVar25[iVar34] = bVar20;
            iVar34 = iVar34 + 1;
          } while (iVar5 != iVar34);
        }
      }
      else if (iVar5 != 0) {
        p_Var9 = (_func_int *)pSVar19->sel_vector;
        uVar33 = 0;
        do {
          uVar24 = uVar33;
          if (p_Var9 != (_func_int *)0x0) {
            uVar24 = (ulong)*(uint *)(p_Var9 + uVar33 * 4);
          }
          if ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_d8 = (undefined1  [8])
                         (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long *)local_d8);
              pdVar27 = local_c8.data;
              pSVar19 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar19;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
              if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar22->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar15 = (byte)uVar33 & 0x3f;
            puVar6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar33 >> 6);
            *puVar6 = *puVar6 & (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
          }
          else {
            local_d8 = *(undefined1 (*) [8])(local_80.data + uVar24 * 0x10);
            pSStack_d0 = *(SelectionVector **)(local_80.data + uVar24 * 0x10 + 8);
            local_c8.data = (data_ptr_t)((ulong)local_d8 & 0xffffffff);
            local_c8.sel = pSStack_d0;
            if (local_c8.data < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xd) {
              local_c8.sel = (SelectionVector *)(local_d8 + 4);
            }
            bVar20 = duckdb_re2::RE2::FullMatchN
                               ((StringPiece *)&local_c8,(RE2 *)&pSVar18->selection_data,(Arg **)0x0
                                ,0);
            pdVar25[uVar33] = bVar20;
          }
          uVar33 = uVar33 + 1;
        } while (iVar5 != uVar33);
      }
LAB_009f6dd2:
      if (local_80.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar25 = result->data;
    puVar6 = (ulong *)vector->data;
    puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar7 != (unsigned_long *)0x0) && ((*puVar7 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_c8.sel = (SelectionVector *)*puVar6;
    local_c8.data = (data_ptr_t)puVar6[1];
    local_80.data = (data_ptr_t)((ulong)local_c8.sel & 0xffffffff);
    local_80.sel = (SelectionVector *)local_c8.data;
    if (local_80.data < (data_ptr_t)0xd) {
      local_80.sel = (SelectionVector *)((long)&local_c8.sel + 4);
    }
    bVar20 = duckdb_re2::RE2::FullMatchN
                       ((StringPiece *)&local_80,(RE2 *)&pSVar18->selection_data,(Arg **)0x0,0);
LAB_009f671a:
    *pdVar25 = bVar20;
    return;
  }
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar25 = result->data;
    if (((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) &&
       ((puVar7 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar7 == (unsigned_long *)0x0 || ((*puVar7 & 1) != 0)))) {
      bVar20 = BinaryLambdaWrapper::
               Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                         (fun,(string_t)
                              ((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector_00->data)->pointer
                          ,in_R9,in_stack_fffffffffffffee8);
      goto LAB_009f671a;
    }
  }
  else {
    iVar5 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      local_f0 = vector->data;
      paVar8 = (anon_union_16_2_67f50693_for_value *)vector_00->data;
      puVar7 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar25 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar5 == 0) {
            return;
          }
          aVar16 = paVar8->pointer;
          local_f0 = local_f0 + 8;
          iVar34 = 0;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)local_f0;
            left_02.value._0_8_ = *(undefined8 *)(local_f0 + -8);
            bVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                               (fun,left_02,(string_t)aVar16,in_R9,in_stack_fffffffffffffee8);
            pdVar25[iVar34] = bVar20;
            iVar34 = iVar34 + 1;
            local_f0 = local_f0 + 0x10;
          } while (iVar5 != iVar34);
          return;
        }
        if (iVar5 + 0x3f < 0x40) {
          return;
        }
        uVar24 = 0;
        uVar33 = 0;
        do {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar7 == (unsigned_long *)0x0) {
            uVar28 = 0xffffffffffffffff;
          }
          else {
            uVar28 = puVar7[uVar24];
          }
          uVar30 = uVar33 + 0x40;
          if (iVar5 <= uVar33 + 0x40) {
            uVar30 = iVar5;
          }
          uVar31 = uVar30;
          if (uVar28 != 0) {
            uVar31 = uVar33;
            if (uVar28 == 0xffffffffffffffff) {
              if (uVar33 < uVar30) {
                aVar16 = paVar8->pointer;
                pdVar27 = local_f0 + uVar33 * 0x10 + 8;
                do {
                  left.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                  left.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                  bVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                     (fun,left,(string_t)aVar16,in_R9,in_stack_fffffffffffffee8);
                  pdVar25[uVar31] = bVar20;
                  uVar31 = uVar31 + 1;
                  pdVar27 = pdVar27 + 0x10;
                } while (uVar30 != uVar31);
              }
            }
            else if (uVar33 < uVar30) {
              pdVar27 = local_f0 + uVar33 * 0x10 + 8;
              uVar32 = 0;
              do {
                if ((uVar28 >> (uVar32 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                  left_00.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                  bVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                     (fun,left_00,(string_t)paVar8->pointer,in_R9,
                                      in_stack_fffffffffffffee8);
                  pdVar25[uVar33] = bVar20;
                }
                uVar33 = uVar33 + 1;
                pdVar27 = pdVar27 + 0x10;
                uVar32 = uVar32 + 1;
                uVar31 = uVar33;
              } while (uVar30 != uVar33);
            }
          }
          uVar24 = uVar24 + 1;
          uVar33 = uVar31;
        } while (uVar24 != iVar5 + 0x3f >> 6);
        return;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar25 = vector->data;
          pdVar27 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,iVar5);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar5 == 0) {
              return;
            }
            lVar26 = 8;
            iVar34 = 0;
            do {
              left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar26);
              left_06.value._0_8_ = *(undefined8 *)(pdVar25 + lVar26 + -8);
              right_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar27 + lVar26);
              right_06.value._0_8_ = *(undefined8 *)(pdVar27 + lVar26 + -8);
              bVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                 (fun,left_06,right_06,in_R9,in_stack_fffffffffffffee8);
              pdVar12[iVar34] = bVar20;
              iVar34 = iVar34 + 1;
              lVar26 = lVar26 + 0x10;
            } while (iVar5 != iVar34);
            return;
          }
          if (iVar5 + 0x3f < 0x40) {
            return;
          }
          uVar24 = 0;
          uVar33 = 0;
          do {
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar7 == (unsigned_long *)0x0) {
              uVar28 = 0xffffffffffffffff;
            }
            else {
              uVar28 = puVar7[uVar24];
            }
            uVar30 = uVar33 + 0x40;
            if (iVar5 <= uVar33 + 0x40) {
              uVar30 = iVar5;
            }
            uVar31 = uVar30;
            if (uVar28 != 0) {
              uVar31 = uVar33;
              if (uVar28 == 0xffffffffffffffff) {
                if (uVar33 < uVar30) {
                  uVar33 = uVar33 << 4 | 8;
                  do {
                    left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar33);
                    left_03.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar33 - 8));
                    right_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar27 + uVar33);
                    right_02.value._0_8_ = *(undefined8 *)(pdVar27 + (uVar33 - 8));
                    bVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                       (fun,left_03,right_02,in_R9,in_stack_fffffffffffffee8);
                    pdVar12[uVar31] = bVar20;
                    uVar31 = uVar31 + 1;
                    uVar33 = uVar33 + 0x10;
                  } while (uVar30 != uVar31);
                }
              }
              else if (uVar33 < uVar30) {
                uVar32 = uVar33 << 4 | 8;
                uVar35 = 0;
                do {
                  if ((uVar28 >> (uVar35 & 0x3f) & 1) != 0) {
                    left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar32);
                    left_04.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar32 - 8));
                    right_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar27 + uVar32);
                    right_03.value._0_8_ = *(undefined8 *)(pdVar27 + (uVar32 - 8));
                    bVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                       (fun,left_04,right_03,in_R9,in_stack_fffffffffffffee8);
                    pdVar12[uVar33] = bVar20;
                  }
                  uVar33 = uVar33 + 1;
                  uVar32 = uVar32 + 0x10;
                  uVar35 = uVar35 + 1;
                  uVar31 = uVar33;
                } while (uVar30 != uVar33);
              }
            }
            uVar24 = uVar24 + 1;
            uVar33 = uVar31;
          } while (uVar24 != iVar5 + 0x3f >> 6);
          return;
        }
        UnifiedVectorFormat::UnifiedVectorFormat(&local_80);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
        Vector::ToUnifiedFormat(vector,iVar5,&local_80);
        Vector::ToUnifiedFormat(vector_00,iVar5,&local_c8);
        Vector::SetVectorType(result,FLAT_VECTOR);
        pSVar19 = local_80.sel;
        pdVar27 = local_c8.data;
        pSVar18 = local_c8.sel;
        pdVar25 = result->data;
        FlatVector::VerifyFlatVector(result);
        if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 &&
            local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar5 != 0) {
            p_Var9 = (_func_int *)pSVar19->sel_vector;
            _Var11._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar18->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (p_Var9 != (_func_int *)0x0) {
                iVar23 = (idx_t)*(uint *)(p_Var9 + iVar34 * 4);
              }
              iVar29 = iVar34;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var11._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                iVar29 = (idx_t)*(uint *)((long)_Var11._M_t.
                                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                _M_head_impl + iVar34 * 4);
              }
              uVar3 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)pdVar27 + iVar29 * 0x10))->_M_use_count;
              uVar13 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)pdVar27 + iVar29 * 0x10))->_M_weak_count;
              right.value._12_4_ = uVar13;
              right.value._8_4_ = uVar3;
              left_01.value.pointer.ptr = (char *)*(undefined8 *)(local_80.data + iVar23 * 0x10 + 8)
              ;
              left_01.value._0_8_ = *(undefined8 *)(local_80.data + iVar23 * 0x10);
              right.value._0_8_ =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pdVar27 + iVar29 * 0x10))
                   ->_vptr__Sp_counted_base;
              bVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                 (fun,left_01,right,in_R9,in_stack_fffffffffffffee8);
              pdVar25[iVar34] = bVar20;
              iVar34 = iVar34 + 1;
            } while (iVar5 != iVar34);
          }
        }
        else if (iVar5 != 0) {
          p_Var9 = (_func_int *)pSVar19->sel_vector;
          _Var11._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
          .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)&pSVar18->sel_vector)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          uVar33 = 0;
          do {
            uVar24 = uVar33;
            if (p_Var9 != (_func_int *)0x0) {
              uVar24 = (ulong)*(uint *)(p_Var9 + uVar33 * 4);
            }
            uVar30 = uVar33;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var11._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              uVar30 = (ulong)*(uint *)((long)_Var11._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + uVar33 * 4);
            }
            if (((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) &&
               ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)))) {
              uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)pdVar27 + uVar30 * 0x10))->_M_use_count;
              uVar14 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)pdVar27 + uVar30 * 0x10))->_M_weak_count;
              right_04.value._12_4_ = uVar14;
              right_04.value._8_4_ = uVar4;
              left_05.value.pointer.ptr = (char *)*(undefined8 *)(local_80.data + uVar24 * 0x10 + 8)
              ;
              left_05.value._0_8_ = *(undefined8 *)(local_80.data + uVar24 * 0x10);
              right_04.value._0_8_ =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pdVar27 + uVar30 * 0x10))
                   ->_vptr__Sp_counted_base;
              bVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                 (fun,left_05,right_04,in_R9,in_stack_fffffffffffffee8);
              pdVar25[uVar33] = bVar20;
            }
            else {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_d8,&local_38);
                pSVar18 = pSStack_d0;
                auVar17 = local_d8;
                local_d8 = (undefined1  [8])0x0;
                pSStack_d0 = (SelectionVector *)0x0;
                p_Var10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_data.internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar17;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar18;
                if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
                }
                if (pSStack_d0 != (SelectionVector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_d0);
                }
                pTVar22 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar22->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar15 = (byte)uVar33 & 0x3f;
              puVar6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar33 >> 6);
              *puVar6 = *puVar6 & (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            uVar33 = uVar33 + 1;
          } while (iVar5 != uVar33);
        }
        if (local_c8.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        goto LAB_009f6dd2;
      }
      paVar8 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_f0 = vector_00->data;
      if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar25 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar5 == 0) {
            return;
          }
          aVar16 = paVar8->pointer;
          local_f0 = local_f0 + 8;
          iVar34 = 0;
          do {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)local_f0;
            right_05.value._0_8_ = *(undefined8 *)(local_f0 + -8);
            bVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                               (fun,(string_t)aVar16,right_05,in_R9,in_stack_fffffffffffffee8);
            pdVar25[iVar34] = bVar20;
            iVar34 = iVar34 + 1;
            local_f0 = local_f0 + 0x10;
          } while (iVar5 != iVar34);
          return;
        }
        if (iVar5 + 0x3f < 0x40) {
          return;
        }
        uVar24 = 0;
        uVar33 = 0;
        do {
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar7 == (unsigned_long *)0x0) {
            uVar28 = 0xffffffffffffffff;
          }
          else {
            uVar28 = puVar7[uVar24];
          }
          uVar30 = uVar33 + 0x40;
          if (iVar5 <= uVar33 + 0x40) {
            uVar30 = iVar5;
          }
          uVar31 = uVar30;
          if (uVar28 != 0) {
            uVar31 = uVar33;
            if (uVar28 == 0xffffffffffffffff) {
              if (uVar33 < uVar30) {
                aVar16 = paVar8->pointer;
                pdVar27 = local_f0 + uVar33 * 0x10 + 8;
                do {
                  right_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                  right_00.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                  bVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                     (fun,(string_t)aVar16,right_00,in_R9,in_stack_fffffffffffffee8)
                  ;
                  pdVar25[uVar31] = bVar20;
                  uVar31 = uVar31 + 1;
                  pdVar27 = pdVar27 + 0x10;
                } while (uVar30 != uVar31);
              }
            }
            else if (uVar33 < uVar30) {
              pdVar27 = local_f0 + uVar33 * 0x10 + 8;
              uVar32 = 0;
              do {
                if ((uVar28 >> (uVar32 & 0x3f) & 1) != 0) {
                  right_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar27;
                  right_01.value._0_8_ = *(undefined8 *)(pdVar27 + -8);
                  bVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                     (fun,(string_t)paVar8->pointer,right_01,in_R9,
                                      in_stack_fffffffffffffee8);
                  pdVar25[uVar33] = bVar20;
                }
                uVar33 = uVar33 + 1;
                pdVar27 = pdVar27 + 0x10;
                uVar32 = uVar32 + 1;
                uVar31 = uVar33;
              } while (uVar30 != uVar33);
            }
          }
          uVar24 = uVar24 + 1;
          uVar33 = uVar31;
        } while (uVar24 != iVar5 + 0x3f >> 6);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void RegexpMatchesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &strings = args.data[0];
	auto &patterns = args.data[1];

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RegexpMatchesBindData>();

	if (info.constant_pattern) {
		auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RegexLocalState>();
		UnaryExecutor::Execute<string_t, bool>(strings, result, args.size(), [&](string_t input) {
			return OP::Operation(CreateStringPiece(input), lstate.constant_pattern);
		});
	} else {
		BinaryExecutor::Execute<string_t, string_t, bool>(strings, patterns, result, args.size(),
		                                                  [&](string_t input, string_t pattern) {
			                                                  RE2 re(CreateStringPiece(pattern), info.options);
			                                                  if (!re.ok()) {
				                                                  throw InvalidInputException(re.error());
			                                                  }
			                                                  return OP::Operation(CreateStringPiece(input), re);
		                                                  });
	}
}